

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_socket_raw(nng_socket id,_Bool *rawp)

{
  _Bool _Var1;
  int iVar2;
  nni_sock *local_20;
  nni_sock *sock;
  
  iVar2 = nni_sock_find(&local_20,id.id);
  if (iVar2 == 0) {
    _Var1 = nni_sock_raw(local_20);
    *rawp = _Var1;
    nni_sock_rele(local_20);
  }
  return iVar2;
}

Assistant:

int
nng_socket_raw(nng_socket id, bool *rawp)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}
	*rawp = nni_sock_raw(sock);
	nni_sock_rele(sock);
	return (0);
}